

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

char * private_RemoveWhiteSpace<false>(json_string *value_t,bool escapeQuotes,size_t *len)

{
  size_type sVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  sVar1 = value_t->_M_string_length;
  pbVar2 = (byte *)malloc(sVar1 + 1);
  pbVar3 = pbVar2;
  if (sVar1 != 0) {
    pbVar6 = (byte *)(value_t->_M_dataplus)._M_p;
    pbVar8 = pbVar6 + sVar1;
    iVar4 = 8;
    do {
      bVar5 = *pbVar6;
      if (((1 < bVar5 - 9) && (bVar5 != 0xd)) && (bVar5 != 0x20)) {
        if (bVar5 == 0x22) {
          *pbVar3 = 0x22;
          pbVar3 = pbVar3 + 1;
          pbVar7 = pbVar6;
          while( true ) {
            pbVar6 = pbVar7 + 1;
            bVar5 = pbVar7[1];
            if (bVar5 == 0x22) break;
            if (pbVar6 == pbVar8) goto LAB_001315a1;
            if (bVar5 == 0x5c) {
              *pbVar3 = 0x5c;
              bVar5 = pbVar7[2];
              if ((escapeQuotes) && (bVar5 == 0x22)) {
                used_ascii_one = true;
                bVar5 = 1;
              }
              pbVar3[1] = bVar5;
              pbVar3 = pbVar3 + 2;
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar3 = bVar5;
              pbVar3 = pbVar3 + 1;
              pbVar7 = pbVar6;
            }
          }
LAB_001314c9:
          if ((byte)(*pbVar6 + 0x81) < 0xa1) goto LAB_001315a1;
          *pbVar3 = *pbVar6;
          pbVar3 = pbVar3 + 1;
        }
        else {
          if (bVar5 == 0x2f) {
            if (pbVar6[1] == 0x2a) {
              pbVar6 = pbVar6 + 3;
              while ((pbVar6[-1] != 0x2a || (*pbVar6 != 0x2f))) {
                pbVar7 = pbVar6 + -1;
                pbVar6 = pbVar6 + 1;
                if (pbVar7 == pbVar8) goto LAB_001315a1;
              }
              goto LAB_001314e5;
            }
            if (pbVar6[1] != 0x2f) goto LAB_001315a1;
            pbVar6 = pbVar6 + 1;
          }
          else if (bVar5 != 0x23) goto LAB_001314c9;
          do {
            pbVar6 = pbVar6 + 1;
            if (pbVar6 == pbVar8) break;
          } while (*pbVar6 != 10);
        }
      }
LAB_001314e5:
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar8);
  }
  iVar4 = 2;
LAB_001315a1:
  if ((iVar4 == 8) || (iVar4 == 2)) {
    *len = (long)pbVar3 - (long)pbVar2;
  }
  return (char *)pbVar2;
}

Assistant:

json_char * private_RemoveWhiteSpace(const json_string & value_t, bool escapeQuotes, size_t & len) json_nothrow {
#endif
	json_char * result;
	json_char * runner = result = json_malloc<json_char>(value_t.length() + 1);  //dealing with raw memory is faster than adding to a json_string
	JSON_ASSERT(result != 0, json_global(ERROR_OUT_OF_MEMORY));
	const json_char * const end = value_t.data() + value_t.length();
	for(const json_char * p = value_t.data(); p != end; ++p){
	  switch(*p){
		 case JSON_TEXT(' '):   //defined as white space
		 case JSON_TEXT('\t'):  //defined as white space
		 case JSON_TEXT('\n'):  //defined as white space
		 case JSON_TEXT('\r'):  //defined as white space
			break;
		#ifndef JSON_STRICT
			case JSON_TEXT('/'):  //a C comment
				if (*(++p) == JSON_TEXT('*')){  //a multiline comment
				   if (T) COMMENT_DELIMITER();
				   while ((*(++p) != JSON_TEXT('*')) || (*(p + 1) != JSON_TEXT('/'))){
					  if(p == end){
							COMMENT_DELIMITER(); 
							goto endofrunner;
						}
					  if (T) *runner++ = *p;
				   }
				   ++p;
				   if (T) COMMENT_DELIMITER();
				   break;
				}
				//Should be a single line C comment, so let it fall through to use the bash comment stripper
				JSON_ASSERT_SAFE(*p == JSON_TEXT('/'), JSON_TEXT("stray / character, not quoted, or a comment"), goto endofrunner;);
			case JSON_TEXT('#'):  //a bash comment
				if (T){
					SingleLineComment(p, end AND_RUNNER);
				} else {
					SingleLineComment(p, end);
				}
				break;
		 #endif
		 case JSON_TEXT('\"'):  //a quote
			*runner++ = JSON_TEXT('\"');
			while(*(++p) != JSON_TEXT('\"')){  //find the end of the quotation, as white space is preserved within it
				if(p == end) goto endofrunner;
				switch(*p){
				   case JSON_TEXT('\\'):
					  *runner++ = JSON_TEXT('\\');
					  if (escapeQuotes){
							*runner++ = (*++p == JSON_TEXT('\"')) ? ascii_one() : *p;  //an escaped quote will reak havoc will all of my searching functions, so change it into an illegal character in JSON for convertion later on
					  } else {
							*runner++ = *++p;
					  }
					  break;
				   default:
					  *runner++ = *p;
					  break;
				}
			}
			//no break, let it fall through so that the trailing quote gets added
		 default:
			JSON_ASSERT_SAFE((json_uchar)*p >= 32, JSON_TEXT("Invalid JSON character detected (lo)"), goto endofrunner;);
			JSON_ASSERT_SAFE((json_uchar)*p <= 126, JSON_TEXT("Invalid JSON character detected (hi)"), goto endofrunner;);
			*runner++ = *p;
			break;
	  }
	}
	endofrunner:
	len = runner - result;
	return result;
}